

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

string * __thiscall
CoreML::enumeratedShapesToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *enumerated,bool useArrayFormat)

{
  ulong uVar1;
  char *pcVar2;
  size_type sVar3;
  CoreML *this_00;
  string local_208;
  ulong local_1e8;
  size_t i;
  allocator local_1c9;
  string local_1c8 [8];
  string separator;
  stringstream ss;
  ostream local_198 [383];
  byte local_19;
  CoreML *pCStack_18;
  bool useArrayFormat_local;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *enumerated_local;
  
  local_19 = (byte)enumerated & 1;
  pCStack_18 = this;
  enumerated_local =
       (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)(separator.field_2._M_local_buf + 8));
  pcVar2 = " | ";
  if ((local_19 & 1) != 0) {
    pcVar2 = ", ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,pcVar2,&local_1c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  if ((local_19 & 1) != 0) {
    std::operator<<(local_198,"[");
  }
  local_1e8 = 0;
  while( true ) {
    uVar1 = local_1e8;
    sVar3 = std::
            vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ::size((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    *)pCStack_18);
    if (sVar3 <= uVar1) break;
    this_00 = (CoreML *)
              std::
              vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            *)pCStack_18,local_1e8);
    dimensionsToString_abi_cxx11_
              (&local_208,this_00,(vector<long,_std::allocator<long>_> *)(ulong)(local_19 & 1),
               SUB81(sVar3,0));
    std::operator<<(local_198,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    uVar1 = local_1e8;
    sVar3 = std::
            vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ::size((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    *)pCStack_18);
    if (uVar1 < sVar3 - 1) {
      std::operator<<(local_198,local_1c8);
    }
    local_1e8 = local_1e8 + 1;
  }
  if ((local_19 & 1) != 0) {
    std::operator<<(local_198,"]");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)(separator.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

static std::string enumeratedShapesToString(const std::vector<std::vector<int64_t>> &enumerated, bool useArrayFormat = false) {
        std::stringstream ss;
        std::string separator = useArrayFormat ? ", " : " | ";

        if (useArrayFormat) {
            ss << "[";
        }

        for (size_t i=0; i<enumerated.size(); i++) {
            ss << dimensionsToString(enumerated[i],useArrayFormat);
            if (i < enumerated.size() - 1) { ss << separator; }
        }

        if (useArrayFormat) {
            ss << "]";
        }

        return ss.str();
    }